

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

void __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::SymDiff
          (MP<137UL,_GF2::MOGrlex<137UL>_> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *polyRight)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_const_iterator<GF2::MM<137UL>_> __first;
  
  if (this == polyRight) {
    std::__cxx11::list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>::clear
              (&this->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>);
    return;
  }
  p_Var3 = (this->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
           super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  __first._M_node =
       (polyRight->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
       super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  if (__first._M_node != (_List_node_base *)polyRight && p_Var3 != (_List_node_base *)this) {
    p_Var4 = p_Var3;
    do {
      iVar2 = MOGrlex<137UL>::Compare
                        ((MOGrlex<137UL> *)&this->field_0x18,(MM<137UL> *)(p_Var4 + 1),
                         (MM<137UL> *)(__first._M_node + 1));
      if (iVar2 < 1) {
        if (iVar2 < 0) {
          p_Var3 = (_List_node_base *)operator_new(0x28);
          p_Var4 = __first._M_node[1]._M_prev;
          p_Var3[1]._M_next =
               (_List_node_base *)((WW<137UL> *)&__first._M_node[1]._M_next)->_words[0];
          p_Var3[1]._M_prev = p_Var4;
          p_Var3[2]._M_next =
               (((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)
                &__first._M_node[2]._M_next)->
               super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
          std::__detail::_List_node_base::_M_hook(p_Var3);
          psVar1 = &(this->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
                    super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          p_Var3 = p_Var4->_M_next;
          psVar1 = &(this->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
                    super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var4,0x28);
        }
        __first._M_node =
             (((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)&(__first._M_node)->_M_next
              )->super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>)._M_impl._M_node
             .super__List_node_base._M_next;
      }
      else {
        p_Var3 = p_Var4->_M_next;
      }
    } while ((p_Var3 != (_List_node_base *)this) &&
            (p_Var4 = p_Var3, __first._M_node != (_List_node_base *)polyRight));
  }
  if (p_Var3 != (_List_node_base *)this) {
    return;
  }
  std::__cxx11::list<GF2::MM<137ul>,std::allocator<GF2::MM<137ul>>>::
  insert<std::_List_const_iterator<GF2::MM<137ul>>,void>
            ((list<GF2::MM<137ul>,std::allocator<GF2::MM<137ul>>> *)this,(const_iterator)this,
             __first,(_List_const_iterator<GF2::MM<137UL>_>)polyRight);
  return;
}

Assistant:

void SymDiff(const MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin();
		const_iterator iterRight = polyRight.begin();
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// вставить новый моном
				if (cmp < 0) iter = insert(iter, *iterRight);
				// исключить повтор
				else iter = erase(iter);
				// к следующему 
				++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			insert(end(), iterRight, polyRight.end());
	}